

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<0,(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  uint uVar1;
  size_t sVar2;
  pointer pdVar3;
  int *piVar4;
  pointer piVar5;
  pointer piVar6;
  ulong uVar7;
  pointer piVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  bool isSupported;
  int *r;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<double,_std::allocator<double>_> basis_derivative;
  bool local_92;
  allocator_type local_91;
  int *local_90;
  double *local_88;
  _Vector_base<int,_std::allocator<int>_> local_80;
  int *local_68;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_88 = x;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_60,(long)this->top_level + 1,
             (allocator_type *)&local_80);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_80,(long)this->top_level + 1,
             (allocator_type *)&local_48);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)(this->super_BaseCanonicalGrid).num_dimensions,&local_91);
  local_68 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  piVar4 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (piVar4 != local_68) {
    local_90 = piVar4;
    dVar13 = evalBasisSupported<(TasGrid::RuleLocal::erule)3>
                       (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + (long)*piVar4 * work->num_dimensions
                        ,local_88,&local_92);
    if (local_92 == true) {
      iVar9 = *local_90;
      sVar2 = (this->surpluses).stride;
      pdVar3 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = (this->super_BaseCanonicalGrid).num_outputs;
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = 0;
      }
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        y[uVar10] = pdVar3[(long)iVar9 * sVar2 + uVar10] * dVar13 + y[uVar10];
      }
      *local_80._M_impl.super__Vector_impl_data._M_start = iVar9;
      piVar6 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar6[*local_90];
      *local_60._M_impl.super__Vector_impl_data._M_start = iVar9;
      iVar11 = 0;
      piVar5 = local_80._M_impl.super__Vector_impl_data._M_start;
      piVar8 = local_60._M_impl.super__Vector_impl_data._M_start;
      while (iVar9 < piVar6[(long)*piVar5 + 1]) {
        if (piVar8[iVar11] < piVar6[(long)piVar5[iVar11] + 1]) {
          iVar9 = (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[piVar8[iVar11]];
          lVar12 = (long)iVar9;
          dVar13 = evalBasisSupported<(TasGrid::RuleLocal::erule)3>
                             (this,(work->indexes).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start +
                                   work->num_dimensions * lVar12,local_88,&local_92);
          piVar5 = local_80._M_impl.super__Vector_impl_data._M_start;
          piVar8 = local_60._M_impl.super__Vector_impl_data._M_start;
          if (local_92 == true) {
            sVar2 = (this->surpluses).stride;
            pdVar3 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar1 = (this->super_BaseCanonicalGrid).num_outputs;
            uVar7 = (ulong)uVar1;
            if ((int)uVar1 < 1) {
              uVar7 = 0;
            }
            for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
              y[uVar10] = pdVar3[sVar2 * lVar12 + uVar10] * dVar13 + y[uVar10];
            }
            local_80._M_impl.super__Vector_impl_data._M_start[(long)iVar11 + 1] = iVar9;
            piVar6 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_60._M_impl.super__Vector_impl_data._M_start[(long)iVar11 + 1] = piVar6[lVar12];
            iVar11 = iVar11 + 1;
          }
          else {
            local_60._M_impl.super__Vector_impl_data._M_start[iVar11] =
                 local_60._M_impl.super__Vector_impl_data._M_start[iVar11] + 1;
            piVar6 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
        }
        else {
          piVar8[(long)iVar11 + -1] = piVar8[(long)iVar11 + -1] + 1;
          iVar11 = iVar11 + -1;
        }
        iVar9 = *piVar8;
      }
    }
    piVar4 = local_90 + 1;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_80);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }